

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::
list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::split(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *first,
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *second)

{
  long lVar1;
  undefined **local_28;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  undefined **local_18;
  node *local_10;
  
  local_20 = first->m_head;
  lVar1 = (first->m_size >> 1) + 1;
  do {
    local_20 = local_20->next;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  local_28 = &PTR__listIterator_0010dce0;
  local_10 = first->m_tail;
  local_18 = &PTR__listIterator_0010dce0;
  splice(second,(int)&stack0xffffffffffffffc8,(__off64_t *)first,(int)&local_28,
         (__off64_t *)&local_18,0x10dce0,0x10dce0);
  return;
}

Assistant:

void split(list & first, list & second) {
		iterator	it(first.begin());
		for (size_type i = 0; i < first.size() / 2; ++i)
			++it;
		second.splice(second.begin(), first, it, first.end());
	}